

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestRefcounting(void)

{
  int iVar1;
  int iVar2;
  Template *pTVar3;
  long lVar4;
  TemplateId TVar5;
  TemplateId TVar6;
  TemplateString *this;
  Template *pTVar7;
  long lVar8;
  allocator local_141;
  string local_140;
  TemplateCache cache1;
  string filename2;
  string filename1;
  TemplateDictionary dict;
  
  ctemplate::TemplateCache::TemplateCache(&cache1);
  ctemplate::TemplateString::TemplateString((TemplateString *)&filename1,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&filename1,(UnsafeArena *)0x0);
  std::__cxx11::string::string((string *)&filename2,"{valid template}",(allocator *)&local_140);
  ctemplate::StringToTemplateFile(&filename1,&filename2);
  std::__cxx11::string::~string((string *)&filename2);
  std::__cxx11::string::string((string *)&local_140,"{another valid template}",&local_141);
  ctemplate::StringToTemplateFile(&filename2,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  local_140._M_dataplus._M_p = filename1._M_dataplus._M_p;
  local_140.field_2._M_local_buf[0] = '\0';
  local_140.field_2._8_8_ = 0;
  pTVar3 = (Template *)
           ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&local_140);
  if (pTVar3 == (Template *)0x0) {
    __assert_fail("cache1_tpl1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x25c,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  local_140._M_dataplus._M_p = filename2._M_dataplus._M_p;
  local_140.field_2._M_local_buf[0] = '\0';
  local_140.field_2._8_8_ = 0;
  lVar4 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&local_140);
  if (lVar4 == 0) {
    __assert_fail("cache1_tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x25f,"static void TemplateCacheUnittest::TestRefcounting()");
  }
  TVar5 = ctemplate::GlobalIdForTest(filename1._M_dataplus._M_p,(int)filename1._M_string_length);
  iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
  if (iVar1 == 2) {
    TVar6 = ctemplate::GlobalIdForTest(filename2._M_dataplus._M_p,(int)filename2._M_string_length);
    iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
    if (iVar1 == 2) {
      this = (TemplateString *)ctemplate::TemplateCache::Clone();
      iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
      if (iVar1 == 3) {
        iVar1 = ctemplate::TemplateCache::Refcount(this,TVar5,2);
        if (iVar1 == 3) {
          iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
          if (iVar1 == 3) {
            iVar1 = ctemplate::TemplateCache::Refcount(this,TVar6,2);
            if (iVar1 == 3) {
              local_140._M_dataplus._M_p = filename1._M_dataplus._M_p;
              local_140.field_2._M_local_buf[0] = '\0';
              local_140.field_2._8_8_ = 0;
              pTVar7 = (Template *)ctemplate::TemplateCache::GetTemplate(this,(Strip)&local_140);
              local_140._M_dataplus._M_p = filename2._M_dataplus._M_p;
              local_140.field_2._M_local_buf[0] = '\0';
              local_140.field_2._8_8_ = 0;
              lVar8 = ctemplate::TemplateCache::GetTemplate(this,(Strip)&local_140);
              if (pTVar7 != pTVar3) {
                printf("ASSERT FAILED, line %d: %s\n",0x277,"cache2_tpl1 == cache1_tpl1");
                __assert_fail("cache2_tpl1 == cache1_tpl1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                              ,0x277,"static void TemplateCacheUnittest::TestRefcounting()");
              }
              if (lVar8 != lVar4) {
                printf("ASSERT FAILED, line %d: %s\n",0x278,"cache2_tpl2 == cache1_tpl2");
                __assert_fail("cache2_tpl2 == cache1_tpl2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                              ,0x278,"static void TemplateCacheUnittest::TestRefcounting()");
              }
              iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
              if (iVar1 == 4) {
                iVar1 = ctemplate::TemplateCache::Refcount(this,TVar5,2);
                if (iVar1 == 4) {
                  iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
                  if (iVar1 == 4) {
                    iVar1 = ctemplate::TemplateCache::Refcount(this,TVar6,2);
                    if (iVar1 == 4) {
                      std::__cxx11::string::string
                                ((string *)&local_140,"{file1 contents changed}",&local_141);
                      ctemplate::StringToFile(&local_140,&filename1);
                      std::__cxx11::string::~string((string *)&local_140);
                      ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)this);
                      local_140._M_dataplus._M_p = filename1._M_dataplus._M_p;
                      local_140.field_2._M_local_buf[0] = '\0';
                      local_140.field_2._8_8_ = 0;
                      pTVar7 = (Template *)
                               ctemplate::TemplateCache::GetTemplate(this,(Strip)&local_140);
                      if (pTVar7 == pTVar3) {
                        printf("ASSERT FAILED, line %d: %s\n",0x288,
                               "cache2_tpl1_post_reload != cache2_tpl1");
                        __assert_fail("cache2_tpl1_post_reload != cache2_tpl1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                      ,0x288,"static void TemplateCacheUnittest::TestRefcounting()")
                        ;
                      }
                      std::__cxx11::string::string
                                ((string *)&local_140,"{file1 contents changed}",&local_141);
                      ctemplate::AssertExpandIs(pTVar7,&dict,&local_140,true);
                      std::__cxx11::string::~string((string *)&local_140);
                      local_140._M_dataplus._M_p = filename2._M_dataplus._M_p;
                      local_140.field_2._M_local_buf[0] = '\0';
                      local_140.field_2._8_8_ = 0;
                      lVar8 = ctemplate::TemplateCache::GetTemplate(this,(Strip)&local_140);
                      if (lVar8 != lVar4) {
                        printf("ASSERT FAILED, line %d: %s\n",0x290,
                               "cache2_tpl2_post_reload == cache2_tpl2");
                        __assert_fail("cache2_tpl2_post_reload == cache2_tpl2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                      ,0x290,"static void TemplateCacheUnittest::TestRefcounting()")
                        ;
                      }
                      iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
                      if (iVar1 == 3) {
                        iVar1 = ctemplate::TemplateCache::Refcount(this,TVar5,2);
                        if (iVar1 == 2) {
                          iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
                          if (iVar1 == 5) {
                            iVar2 = ctemplate::TemplateCache::Refcount(this,TVar6,2);
                            iVar1 = (int)ctemplate::Template::num_deletes_;
                            if (iVar2 == 5) {
                              ctemplate::TemplateCache::DoneWithGetTemplatePtrs();
                              iVar2 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
                              if (iVar2 == 2) {
                                iVar2 = ctemplate::TemplateCache::Refcount(this,TVar5,2);
                                if (iVar2 == 1) {
                                  iVar2 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
                                  if (iVar2 == 3) {
                                    iVar2 = ctemplate::TemplateCache::Refcount(this,TVar6,2);
                                    if (iVar2 == 3) {
                                      ctemplate::TemplateCache::ClearCache();
                                      iVar2 = iVar1 + 1;
                                      if ((int)ctemplate::Template::num_deletes_ == iVar2) {
                                        ctemplate::TemplateCache::ClearCache();
                                        iVar1 = iVar1 + 3;
                                        if ((int)ctemplate::Template::num_deletes_ == iVar1) {
                                          ctemplate::TemplateCache::~TemplateCache
                                                    ((TemplateCache *)this);
                                          operator_delete(this);
                                          std::__cxx11::string::~string((string *)&filename2);
                                          std::__cxx11::string::~string((string *)&filename1);
                                          ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
                                          ctemplate::TemplateCache::~TemplateCache(&cache1);
                                          return;
                                        }
                                        printf("ASSERT FAILED, line %d: %s\n",0x2b0,
                                               "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 3"
                                              );
                                        if ((int)ctemplate::Template::num_deletes_ != iVar1) {
                                          __assert_fail(
                                                  "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 3"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2b0,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                  );
                                        }
                                      }
                                      else {
                                        printf("ASSERT FAILED, line %d: %s\n",0x2ad,
                                               "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 1"
                                              );
                                        if ((int)ctemplate::Template::num_deletes_ != iVar2) {
                                          __assert_fail(
                                                  "cache_peer.NumTotalTemplateDeletes() == old_delete_count + 1"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2ad,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                  );
                                        }
                                      }
                                    }
                                    else {
                                      printf("ASSERT FAILED, line %d: %s\n",0x2a8,
                                             "cache_peer2.Refcount(cache_key2) == 3");
                                      iVar1 = ctemplate::TemplateCache::Refcount(this,TVar6,2);
                                      if (iVar1 != 3) {
                                        __assert_fail("cache_peer2.Refcount(cache_key2) == 3",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2a8,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                  );
                                      }
                                    }
                                  }
                                  else {
                                    printf("ASSERT FAILED, line %d: %s\n",0x2a7,
                                           "cache_peer.Refcount(cache_key2) == 3");
                                    iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
                                    if (iVar1 != 3) {
                                      __assert_fail("cache_peer.Refcount(cache_key2) == 3",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2a7,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                  );
                                    }
                                  }
                                }
                                else {
                                  printf("ASSERT FAILED, line %d: %s\n",0x2a6,
                                         "cache_peer2.Refcount(cache_key1) == 1");
                                  iVar1 = ctemplate::TemplateCache::Refcount(this,TVar5,2);
                                  if (iVar1 != 1) {
                                    __assert_fail("cache_peer2.Refcount(cache_key1) == 1",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x2a6,
                                                  "static void TemplateCacheUnittest::TestRefcounting()"
                                                 );
                                  }
                                }
                              }
                              else {
                                printf("ASSERT FAILED, line %d: %s\n",0x2a5,
                                       "cache_peer.Refcount(cache_key1) == 2");
                                iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
                                if (iVar1 != 2) {
                                  __assert_fail("cache_peer.Refcount(cache_key1) == 2",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                ,0x2a5,
                                                "static void TemplateCacheUnittest::TestRefcounting()"
                                               );
                                }
                              }
                            }
                            else {
                              printf("ASSERT FAILED, line %d: %s\n",0x29c,
                                     "cache_peer2.Refcount(cache_key2) == 5");
                              iVar1 = ctemplate::TemplateCache::Refcount(this,TVar6,2);
                              if (iVar1 != 5) {
                                __assert_fail("cache_peer2.Refcount(cache_key2) == 5",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                              ,0x29c,
                                              "static void TemplateCacheUnittest::TestRefcounting()"
                                             );
                              }
                            }
                          }
                          else {
                            printf("ASSERT FAILED, line %d: %s\n",0x29b,
                                   "cache_peer.Refcount(cache_key2) == 5");
                            iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
                            if (iVar1 != 5) {
                              __assert_fail("cache_peer.Refcount(cache_key2) == 5",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                            ,0x29b,
                                            "static void TemplateCacheUnittest::TestRefcounting()");
                            }
                          }
                        }
                        else {
                          printf("ASSERT FAILED, line %d: %s\n",0x29a,
                                 "cache_peer2.Refcount(cache_key1) == 2");
                          iVar1 = ctemplate::TemplateCache::Refcount(this,TVar5,2);
                          if (iVar1 != 2) {
                            __assert_fail("cache_peer2.Refcount(cache_key1) == 2",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                          ,0x29a,
                                          "static void TemplateCacheUnittest::TestRefcounting()");
                          }
                        }
                      }
                      else {
                        printf("ASSERT FAILED, line %d: %s\n",0x299,
                               "cache_peer.Refcount(cache_key1) == 3");
                        iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
                        if (iVar1 != 3) {
                          __assert_fail("cache_peer.Refcount(cache_key1) == 3",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                        ,0x299,
                                        "static void TemplateCacheUnittest::TestRefcounting()");
                        }
                      }
                    }
                    else {
                      printf("ASSERT FAILED, line %d: %s\n",0x27e,
                             "cache_peer2.Refcount(cache_key2) == 4");
                      iVar1 = ctemplate::TemplateCache::Refcount(this,TVar6,2);
                      if (iVar1 != 4) {
                        __assert_fail("cache_peer2.Refcount(cache_key2) == 4",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                      ,0x27e,"static void TemplateCacheUnittest::TestRefcounting()")
                        ;
                      }
                    }
                  }
                  else {
                    printf("ASSERT FAILED, line %d: %s\n",0x27d,
                           "cache_peer.Refcount(cache_key2) == 4");
                    iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
                    if (iVar1 != 4) {
                      __assert_fail("cache_peer.Refcount(cache_key2) == 4",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                    ,0x27d,"static void TemplateCacheUnittest::TestRefcounting()");
                    }
                  }
                }
                else {
                  printf("ASSERT FAILED, line %d: %s\n",0x27c,
                         "cache_peer2.Refcount(cache_key1) == 4");
                  iVar1 = ctemplate::TemplateCache::Refcount(this,TVar5,2);
                  if (iVar1 != 4) {
                    __assert_fail("cache_peer2.Refcount(cache_key1) == 4",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                  ,0x27c,"static void TemplateCacheUnittest::TestRefcounting()");
                  }
                }
              }
              else {
                printf("ASSERT FAILED, line %d: %s\n",0x27b,"cache_peer.Refcount(cache_key1) == 4");
                iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
                if (iVar1 != 4) {
                  __assert_fail("cache_peer.Refcount(cache_key1) == 4",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                ,0x27b,"static void TemplateCacheUnittest::TestRefcounting()");
                }
              }
            }
            else {
              printf("ASSERT FAILED, line %d: %s\n",0x270,"cache_peer2.Refcount(cache_key2) == 3");
              iVar1 = ctemplate::TemplateCache::Refcount(this,TVar6,2);
              if (iVar1 != 3) {
                __assert_fail("cache_peer2.Refcount(cache_key2) == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                              ,0x270,"static void TemplateCacheUnittest::TestRefcounting()");
              }
            }
          }
          else {
            printf("ASSERT FAILED, line %d: %s\n",0x26f,"cache_peer.Refcount(cache_key2) == 3");
            iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
            if (iVar1 != 3) {
              __assert_fail("cache_peer.Refcount(cache_key2) == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                            ,0x26f,"static void TemplateCacheUnittest::TestRefcounting()");
            }
          }
        }
        else {
          printf("ASSERT FAILED, line %d: %s\n",0x26e,"cache_peer2.Refcount(cache_key1) == 3");
          iVar1 = ctemplate::TemplateCache::Refcount(this,TVar5,2);
          if (iVar1 != 3) {
            __assert_fail("cache_peer2.Refcount(cache_key1) == 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x26e,"static void TemplateCacheUnittest::TestRefcounting()");
          }
        }
      }
      else {
        printf("ASSERT FAILED, line %d: %s\n",0x26d,"cache_peer.Refcount(cache_key1) == 3");
        iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
        if (iVar1 != 3) {
          __assert_fail("cache_peer.Refcount(cache_key1) == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x26d,"static void TemplateCacheUnittest::TestRefcounting()");
        }
      }
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0x266,"cache_peer.Refcount(cache_key2) == 2");
      iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar6,2);
      if (iVar1 != 2) {
        __assert_fail("cache_peer.Refcount(cache_key2) == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x266,"static void TemplateCacheUnittest::TestRefcounting()");
      }
    }
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0x264,"cache_peer.Refcount(cache_key1) == 2");
    iVar1 = ctemplate::TemplateCache::Refcount(&cache1,TVar5,2);
    if (iVar1 != 2) {
      __assert_fail("cache_peer.Refcount(cache_key1) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x264,"static void TemplateCacheUnittest::TestRefcounting()");
    }
  }
  exit(1);
}

Assistant:

static void TestRefcounting() {
    TemplateCache cache1;
    TemplateCachePeer cache_peer(&cache1);
    TemplateDictionary dict("dict");

    // Add templates
    string filename1 = StringToTemplateFile("{valid template}");
    string filename2 = StringToTemplateFile("{another valid template}");

    const Template* cache1_tpl1 = cache1.GetTemplate(filename1,
                                                     STRIP_WHITESPACE);
    assert(cache1_tpl1);
    const Template* cache1_tpl2 = cache1.GetTemplate(filename2,
                                                     STRIP_WHITESPACE);
    assert(cache1_tpl2);

    // Check refcount.  It should be 2 -- one for the originalvalue
    // when it's constructed, and one for the call to GetTemplate.
    TemplateCachePeer::TemplateCacheKey cache_key1(filename1, STRIP_WHITESPACE);
    ASSERT(cache_peer.Refcount(cache_key1) == 2);
    TemplateCachePeer::TemplateCacheKey cache_key2(filename2, STRIP_WHITESPACE);
    ASSERT(cache_peer.Refcount(cache_key2) == 2);

    // Clone cache2 from cache1
    TemplateCache* cache2 = cache1.Clone();
    TemplateCachePeer cache_peer2(cache2);

    // Check refcount was incremented.  It should be the same for both caches.
    ASSERT(cache_peer.Refcount(cache_key1) == 3);
    ASSERT(cache_peer2.Refcount(cache_key1) == 3);
    ASSERT(cache_peer.Refcount(cache_key2) == 3);
    ASSERT(cache_peer2.Refcount(cache_key2) == 3);

    // Check that the template ptrs in both caches are the same.
    const Template* cache2_tpl1 = cache2->GetTemplate(filename1,
                                                      STRIP_WHITESPACE);
    const Template* cache2_tpl2 = cache2->GetTemplate(filename2,
                                                      STRIP_WHITESPACE);
    ASSERT(cache2_tpl1 == cache1_tpl1);
    ASSERT(cache2_tpl2 == cache1_tpl2);

    // GetTemplate should have augmented the refcount.
    ASSERT(cache_peer.Refcount(cache_key1) == 4);
    ASSERT(cache_peer2.Refcount(cache_key1) == 4);
    ASSERT(cache_peer.Refcount(cache_key2) == 4);
    ASSERT(cache_peer2.Refcount(cache_key2) == 4);

    // Change tpl1 file contents and reload.
    StringToFile("{file1 contents changed}", filename1);
    cache2->ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    // Since the template will be reloaded into a new instance,
    // GetTemplate will return new pointers. The older template
    // pointer was moved to the freelist.
    const Template* cache2_tpl1_post_reload = cache2->GetTemplate(
        filename1, STRIP_WHITESPACE);
    ASSERT(cache2_tpl1_post_reload != cache2_tpl1);
    // Check that cache1's tpl1 has the new contents
    AssertExpandIs(cache2_tpl1_post_reload, &dict, "{file1 contents changed}",
                   true);

    // Ensure tpl2 is unchanged
    const Template* cache2_tpl2_post_reload = cache2->GetTemplate(
        filename2, STRIP_WHITESPACE);
    ASSERT(cache2_tpl2_post_reload == cache2_tpl2);

    // Now key1 points to different templates in cache1 and cache2.
    // cache1's version should have a refcount of 3 (was 4, went down
    // by 1 when cache2 dropped its reference to it).  cache2's
    // version should be 2 (one for the new file, 1 for the call to
    // GetTemplate() that followed it), while key2 should have a
    // refcount of 5 in both caches (due to the new call, above, to
    // GetTemplate()).
    ASSERT(cache_peer.Refcount(cache_key1) == 3);
    ASSERT(cache_peer2.Refcount(cache_key1) == 2);
    ASSERT(cache_peer.Refcount(cache_key2) == 5);
    ASSERT(cache_peer2.Refcount(cache_key2) == 5);

    const int old_delete_count = cache_peer.NumTotalTemplateDeletes();

    // Clear up the cache2's freelist, this should drop all refcounts,
    // due to the calls cache_peer2 made to
    // GetTemplate(the-old-filename1), GetTemplate(the-new-filename1),
    // and GetTemplate(filename2) (twice!)
    cache_peer2.DoneWithGetTemplatePtrs();
    ASSERT(cache_peer.Refcount(cache_key1) == 2);
    ASSERT(cache_peer2.Refcount(cache_key1) == 1);
    ASSERT(cache_peer.Refcount(cache_key2) == 3);
    ASSERT(cache_peer2.Refcount(cache_key2) == 3);

    // Make sure that deleting from the cache causes deletion.
    // ClearCache() on peer1 should finally get rid of the old filename1.
    cache_peer.ClearCache();
    ASSERT(cache_peer.NumTotalTemplateDeletes() == old_delete_count + 1);
    cache_peer2.ClearCache();
    // Delete-count should go up by 2 as both the new tpl1, and tpl2, go away.
    ASSERT(cache_peer.NumTotalTemplateDeletes() == old_delete_count + 3);

    delete cache2;
  }